

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderPerformanceCase.cpp
# Opt level: O1

void __thiscall
deqp::gls::ShaderPerformanceCase::setVertexFragmentRatio
          (ShaderPerformanceCase *this,float fragmentsPerVertices)

{
  ostringstream *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int iVar5;
  int precision;
  int precision_00;
  int iVar6;
  int gridH;
  int gridW;
  float fVar7;
  float fVar8;
  float fVar9;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar2 = *(int *)CONCAT44(extraout_var,iVar2);
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar3 = *(int *)(CONCAT44(extraout_var_00,iVar3) + 4);
  iVar4 = 0;
  gridW = 0xff;
  gridH = 0xff;
  do {
    iVar6 = (gridH + 1) * (gridW + 1);
    iVar5 = iVar3 * iVar2;
    fVar8 = (float)iVar5 / (float)iVar6;
    fVar9 = fVar8 - fragmentsPerVertices;
    fVar7 = -fVar9;
    if (-fVar9 <= fVar9) {
      fVar7 = fVar9;
    }
    if (0.01 <= fVar7) {
      if (fragmentsPerVertices <= fVar8) {
        fVar8 = (float)iVar6 * fragmentsPerVertices;
        while ((int)(fVar8 + *(float *)(&DAT_01bc5724 + (ulong)(fVar8 < 0.0) * 4)) < iVar5) {
          bVar1 = iVar2 <= iVar3;
          iVar2 = iVar2 - (uint)(iVar3 < iVar2);
          iVar3 = iVar3 - (uint)bVar1;
          iVar5 = iVar3 * iVar2;
        }
      }
      else {
        fVar8 = (float)iVar5 / fragmentsPerVertices;
        while ((int)(fVar8 + *(float *)(&DAT_01bc5724 + (ulong)(fVar8 < 0.0) * 4)) < iVar6) {
          bVar1 = gridW <= gridH;
          iVar6 = ((gridH - (uint)bVar1) + 1) * ((gridW - (uint)(gridH < gridW)) + 1);
          gridW = gridW - (uint)(gridH < gridW);
          gridH = gridH - (uint)bVar1;
        }
      }
    }
  } while ((0.01 <= fVar7) && (iVar4 = iVar4 + 1, iVar4 != 10));
  local_1b0._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Requested fragment/vertex-ratio: ",0x21);
  de::floatToString_abi_cxx11_(&local_1d0,(de *)0x2,fragmentsPerVertices,precision);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Computed fragment/vertex-ratio: ",0x20);
  de::floatToString_abi_cxx11_
            (&local_1f0,(de *)0x2,(float)(iVar3 * iVar2) / (float)((gridH + 1) * (gridW + 1)),
             precision_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_138);
  ShaderPerformanceMeasurer::setGridSize(&this->m_measurer,gridW,gridH);
  ShaderPerformanceMeasurer::setViewportSize(&this->m_measurer,iVar2,iVar3);
  return;
}

Assistant:

void ShaderPerformanceCase::setVertexFragmentRatio (float fragmentsPerVertices)
{
	const float	eps			= 0.01f;
	int			gridW		= 255;
	int			gridH		= 255;
	int			viewportW	= m_renderCtx.getRenderTarget().getWidth();
	int			viewportH	= m_renderCtx.getRenderTarget().getHeight();

	for (int i = 0; i < 10; i++)
	{
		int		numVert	= (gridW+1)*(gridH+1);
		int		numFrag	= viewportW*viewportH;
		float	ratio	= (float)numFrag / (float)numVert;

		if (de::abs(ratio - fragmentsPerVertices) < eps)
			break;
		else if (ratio < fragmentsPerVertices)
		{
			// Not enough fragments.
			numVert = deRoundFloatToInt32((float)numFrag / fragmentsPerVertices);

			while ((gridW+1)*(gridH+1) > numVert)
			{
				if (gridW > gridH)
					gridW -= 1;
				else
					gridH -= 1;
			}
		}
		else
		{
			// Not enough vertices.
			numFrag = deRoundFloatToInt32((float)numVert * fragmentsPerVertices);

			while (viewportW*viewportH > numFrag)
			{
				if (viewportW > viewportH)
					viewportW -= 1;
				else
					viewportH -= 1;
			}
		}
	}

	float finalRatio = (float)(viewportW*viewportH) / (float)((gridW+1)*(gridH+1));
	m_testCtx.getLog() << TestLog::Message << "Requested fragment/vertex-ratio: " << de::floatToString(fragmentsPerVertices, 2) << "\n"
										   << "Computed fragment/vertex-ratio: " << de::floatToString(finalRatio, 2)
					   << TestLog::EndMessage;

	setGridSize(gridW, gridH);
	setViewportSize(viewportW, viewportH);
}